

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

bool Geometry::OnLine(Point *p,Line *l)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool local_1e9;
  Point local_1c8;
  byte local_1a9;
  Point local_1a8;
  Point local_190;
  byte local_17a;
  byte local_179;
  Point local_178;
  byte local_159;
  Point local_158;
  Point local_140;
  byte local_12a;
  byte local_129;
  Point local_128;
  byte local_109;
  Point local_108;
  Point local_f0;
  byte local_da;
  byte local_d9;
  Point local_d8;
  byte local_b9;
  Point local_b8;
  Point local_a8;
  Point local_98;
  Point local_88;
  Point local_78 [2];
  Point local_58;
  Point local_48;
  Point local_30;
  Line *local_20;
  Line *l_local;
  Point *p_local;
  
  local_48.x = (l->a).x;
  local_48.y = (l->a).y;
  local_58.x = p->x;
  local_58.y = p->y;
  local_b9 = 0;
  local_d9 = 0;
  local_da = 0;
  local_109 = 0;
  local_129 = 0;
  local_12a = 0;
  local_159 = 0;
  local_179 = 0;
  local_17a = 0;
  local_1a9 = 0;
  bVar3 = false;
  bVar2 = false;
  local_20 = l;
  l_local = (Line *)p;
  operator-((Geometry *)&local_30,&local_48,&local_58);
  local_88.x = (l->b).x;
  local_88.y = (l->b).y;
  local_98.x = p->x;
  local_98.y = p->y;
  operator-((Geometry *)local_78,&local_88,&local_98);
  dVar1 = operator*(&local_30,local_78);
  iVar4 = sgn(dVar1);
  local_1e9 = false;
  if (iVar4 == 0) {
    local_b8.x = p->x;
    local_b8.y = p->y;
    local_b9 = 1;
    local_d8.x = (l->a).x;
    local_d8.y = (l->a).y;
    local_d9 = 1;
    operator-((Geometry *)&local_a8,&local_b8,&local_d8);
    local_da = 1;
    local_108.x = (l->b).x;
    local_108.y = (l->b).y;
    local_109 = 1;
    local_128.x = (l->a).x;
    local_128.y = (l->a).y;
    local_129 = 1;
    operator-((Geometry *)&local_f0,&local_108,&local_128);
    local_12a = 1;
    dVar1 = operator^(&local_a8,&local_f0);
    iVar4 = sgn(dVar1);
    local_1e9 = false;
    if (-1 < iVar4) {
      local_158.x = p->x;
      local_158.y = p->y;
      local_159 = 1;
      local_178.x = (l->b).x;
      local_178.y = (l->b).y;
      local_179 = 1;
      operator-((Geometry *)&local_140,&local_158,&local_178);
      local_17a = 1;
      local_1a8.x = (l->a).x;
      local_1a8.y = (l->a).y;
      local_1a9 = 1;
      local_1c8.x = (l->b).x;
      local_1c8.y = (l->b).y;
      bVar3 = true;
      operator-((Geometry *)&local_190,&local_1a8,&local_1c8);
      bVar2 = true;
      dVar1 = operator^(&local_140,&local_190);
      iVar4 = sgn(dVar1);
      local_1e9 = -1 < iVar4;
    }
  }
  p_local._7_1_ = local_1e9;
  if (bVar2) {
    Point::~Point(&local_190);
  }
  if (bVar3) {
    Point::~Point(&local_1c8);
  }
  if ((local_1a9 & 1) != 0) {
    Point::~Point(&local_1a8);
  }
  if ((local_17a & 1) != 0) {
    Point::~Point(&local_140);
  }
  if ((local_179 & 1) != 0) {
    Point::~Point(&local_178);
  }
  if ((local_159 & 1) != 0) {
    Point::~Point(&local_158);
  }
  if ((local_12a & 1) != 0) {
    Point::~Point(&local_f0);
  }
  if ((local_129 & 1) != 0) {
    Point::~Point(&local_128);
  }
  if ((local_109 & 1) != 0) {
    Point::~Point(&local_108);
  }
  if ((local_da & 1) != 0) {
    Point::~Point(&local_a8);
  }
  if ((local_d9 & 1) != 0) {
    Point::~Point(&local_d8);
  }
  if ((local_b9 & 1) != 0) {
    Point::~Point(&local_b8);
  }
  Point::~Point(local_78);
  Point::~Point(&local_98);
  Point::~Point(&local_88);
  Point::~Point(&local_30);
  Point::~Point(&local_58);
  Point::~Point(&local_48);
  return (bool)(p_local._7_1_ & 1);
}

Assistant:

bool OnLine(Point p, Line l){
		return sgn((l.a - p) * (l.b - p)) == 0 && sgn((p - l.a) ^ (l.b - l.a)) >= 0 && sgn((p - l.b) ^ (l.a - l.b)) >= 0;
	}